

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snestistics.cpp
# Opt level: O0

void dma_report(ReportWriter *writer,Trace *trace,AnnotationResolver *annotations)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *local_10d8;
  char *local_10b8;
  uint local_10a0;
  uint local_109c;
  Annotation *pAStack_1098;
  Pointer target;
  Annotation *from;
  reference pDStack_1088;
  bool print_pc;
  DmaTransfer *d;
  const_iterator __end1;
  const_iterator __begin1;
  vector<snestistics::DmaTransfer,_std::allocator<snestistics::DmaTransfer>_> *__range1;
  Annotation *pAStack_1060;
  Pointer reported_pc;
  Annotation *reported_function;
  StringBuilder sb;
  undefined1 local_48 [8];
  Profile profile;
  AnnotationResolver *annotations_local;
  Trace *trace_local;
  ReportWriter *writer_local;
  
  profile._16_8_ = annotations;
  snestistics::Profile::Profile((Profile *)local_48,"DMA report",true);
  ReportWriter::writeSeperator(writer,"DMA analysis");
  ReportWriter::writeComment(writer,"");
  ReportWriter::writeComment(writer,"Currently not sure if we can deduce step or not!");
  ReportWriter::writeComment
            (writer,
             "Currently not doing anything with data annotations! Let me know what I could do!");
  ReportWriter::writeComment(writer,"HDMA is not supported. Can be added in.");
  ReportWriter::writeComment(writer,"");
  snestistics::StringBuilder::StringBuilder((StringBuilder *)&reported_function);
  pAStack_1060 = (Annotation *)0x0;
  __range1._4_4_ = 0xffffffff;
  __end1 = std::vector<snestistics::DmaTransfer,_std::allocator<snestistics::DmaTransfer>_>::begin
                     (&trace->dma_transfers);
  d = (DmaTransfer *)
      std::vector<snestistics::DmaTransfer,_std::allocator<snestistics::DmaTransfer>_>::end
                (&trace->dma_transfers);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_snestistics::DmaTransfer_*,_std::vector<snestistics::DmaTransfer,_std::allocator<snestistics::DmaTransfer>_>_>
                                     *)&d), bVar1) {
    pDStack_1088 = __gnu_cxx::
                   __normal_iterator<const_snestistics::DmaTransfer_*,_std::vector<snestistics::DmaTransfer,_std::allocator<snestistics::DmaTransfer>_>_>
                   ::operator*(&__end1);
    from._7_1_ = 0;
    if (__range1._4_4_ != pDStack_1088->pc) {
      snestistics::AnnotationResolver::resolve_annotation
                ((AnnotationResolver *)profile._16_8_,pDStack_1088->pc,&stack0xffffffffffffef68,
                 (Annotation **)0x0);
      if (pAStack_1060 != pAStack_1098) {
        pAStack_1060 = pAStack_1098;
        if (pAStack_1098 == (Annotation *)0x0) {
          snestistics::StringBuilder::format((StringBuilder *)&reported_function,"(unannotated)");
        }
        else {
          uVar2 = std::__cxx11::string::c_str();
          snestistics::StringBuilder::format((StringBuilder *)&reported_function,"%s",uVar2);
        }
      }
      from._7_1_ = 1;
      __range1._4_4_ = pDStack_1088->pc;
    }
    snestistics::StringBuilder::column((StringBuilder *)&reported_function,0x1e,4);
    snestistics::StringBuilder::format
              ((StringBuilder *)&reported_function,"%d",(ulong)pDStack_1088->channel);
    local_109c = pDStack_1088->b_address | 0x2100;
    if (pDStack_1088->b_address == 0x80) {
      local_109c = pDStack_1088->wram;
    }
    snestistics::StringBuilder::column((StringBuilder *)&reported_function,0x18,4);
    if (pDStack_1088->transfer_bytes == 0) {
      local_10a0 = 0x10000;
    }
    else {
      local_10a0 = (uint)pDStack_1088->transfer_bytes;
    }
    if ((pDStack_1088->flags & 1) == 0) {
      local_10b8 = "->";
    }
    else {
      local_10b8 = "<-";
    }
    if ((pDStack_1088->flags & 4) == 0) {
      local_10d8 = " (inc)";
    }
    else {
      local_10d8 = " (dec)";
    }
    pcVar3 = "";
    if ((pDStack_1088->flags & 2) != 0) {
      pcVar3 = " (fixed)";
    }
    snestistics::StringBuilder::format
              ((StringBuilder *)&reported_function,
               "$%05X $%02X:$%04X %s $%02X:%04X (mode=$%02X)%s%s",(ulong)local_10a0,
               (ulong)pDStack_1088->a_bank,(ulong)pDStack_1088->a_address,local_10b8,
               local_109c >> 0x10,local_109c & 0xffff,(uint)pDStack_1088->transfer_mode,local_10d8,
               pcVar3);
    if ((from._7_1_ & 1) != 0) {
      snestistics::StringBuilder::column((StringBuilder *)&reported_function,0x56,4);
      snestistics::StringBuilder::format
                ((StringBuilder *)&reported_function,"at pc=$%06X",(ulong)pDStack_1088->pc);
    }
    ReportWriter::writeComment(writer,(StringBuilder *)&reported_function);
    __gnu_cxx::
    __normal_iterator<const_snestistics::DmaTransfer_*,_std::vector<snestistics::DmaTransfer,_std::allocator<snestistics::DmaTransfer>_>_>
    ::operator++(&__end1);
  }
  snestistics::Profile::~Profile((Profile *)local_48);
  return;
}

Assistant:

void dma_report(ReportWriter &writer, const Trace &trace, const AnnotationResolver &annotations) {
	Profile profile("DMA report", true);
	writer.writeSeperator("DMA analysis");
	writer.writeComment("");
	writer.writeComment("Currently not sure if we can deduce step or not!");
	writer.writeComment("Currently not doing anything with data annotations! Let me know what I could do!");
	writer.writeComment("HDMA is not supported. Can be added in.");
	writer.writeComment("");

	StringBuilder sb;

	const Annotation* reported_function = nullptr;
	Pointer reported_pc = -1;

	for (const DmaTransfer &d : trace.dma_transfers) {

		bool print_pc = false;

		if (reported_pc != d.pc) {
			const Annotation *from;
			annotations.resolve_annotation(d.pc, &from);

			if (reported_function != from) {
				reported_function = from;

				if (from) {
					sb.format("%s", from->name.c_str());
				} else {
					sb.format("(unannotated)");
				}
			}

			print_pc = true;
			reported_pc = d.pc;
		}

		sb.column(30); sb.format("%d", d.channel);

		Pointer target = 0x2100|d.b_address;
		if (d.b_address == 0x80) {
			target = d.wram;
		}
		sb.column(24); sb.format("$%05X $%02X:$%04X %s $%02X:%04X (mode=$%02X)%s%s", d.transfer_bytes == 0 ? 0x10000 : d.transfer_bytes, d.a_bank, d.a_address, d.flags & DmaTransfer::REVERSE_TRANSFER ? "<-":"->", target>>16, target&0xFFFF, d.transfer_mode, d.flags & DmaTransfer::A_ADDRESS_DECREMENT ?" (dec)":" (inc)", d.flags & DmaTransfer::A_ADDRESS_FIXED ? " (fixed)":"");

		if (print_pc) {
			sb.column(86);  sb.format("at pc=$%06X", d.pc);
		}
		writer.writeComment(sb);
	}
}